

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O1

void __thiscall SWDOperation::AddFrames(SWDOperation *this,SWDAnalyzerResults *pResults)

{
  pointer pSVar1;
  long lVar2;
  long lVar3;
  pointer pSVar4;
  SWDRequestFrame req;
  long local_a8;
  long lStack_a0;
  ulong local_98;
  ulong uStack_90;
  undefined2 local_88;
  SWDBit local_78;
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  undefined1 local_30;
  byte local_2f;
  
  Frame::Frame((Frame *)&local_a8);
  if (0xb < (ulong)(((long)(this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
    Frame::Frame((Frame *)&local_50);
    pSVar1 = (this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (pSVar1->rising - pSVar1->low_start) / 2;
    lVar2 = (pSVar1->low_end - pSVar1->falling) / 2;
    if (lVar3 < lVar2) {
      lVar2 = lVar3;
    }
    local_50 = (pSVar1->rising - lVar2) + 1;
    lVar3 = (pSVar1[7].rising - pSVar1[7].low_start) / 2;
    lVar2 = (pSVar1[7].low_end - pSVar1[7].falling) / 2;
    if (lVar3 < lVar2) {
      lVar2 = lVar3;
    }
    local_48 = pSVar1[7].falling + lVar2 + -1;
    local_2f = this->APnDP * '\x02' | this->RnW;
    local_40 = (ulong)this->request_byte;
    local_38 = (ulong)this->reg;
    local_30 = 3;
    AnalyzerResults::AddFrame((Frame *)pResults);
    SWDBit::MakeFrame(&local_78);
    local_88 = (undefined2)local_78.low_end;
    local_98 = local_78.rising;
    uStack_90 = local_78.falling;
    local_a8._0_4_ = local_78.state_rising;
    local_a8._4_4_ = local_78.state_falling;
    lStack_a0 = local_78.low_start;
    Frame::~Frame((Frame *)&local_78);
    local_88._0_1_ = 4;
    AnalyzerResults::AddFrame((Frame *)pResults);
    pSVar1 = (this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (pSVar1[9].rising - pSVar1[9].low_start) / 2;
    lVar2 = (pSVar1[9].low_end - pSVar1[9].falling) / 2;
    if (lVar3 < lVar2) {
      lVar2 = lVar3;
    }
    local_a8 = (pSVar1[9].rising - lVar2) + 1;
    lVar3 = (pSVar1[0xb].rising - pSVar1[0xb].low_start) / 2;
    lVar2 = (pSVar1[0xb].low_end - pSVar1[0xb].falling) / 2;
    if (lVar3 < lVar2) {
      lVar2 = lVar3;
    }
    lStack_a0 = pSVar1[0xb].falling + lVar2 + -1;
    local_88 = CONCAT11(local_88._1_1_,5);
    local_98 = (ulong)this->ACK;
    AnalyzerResults::AddFrame((Frame *)pResults);
    pSVar1 = (this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0x2c < (ulong)(((long)(this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
                      -0x3333333333333333)) {
      pSVar4 = pSVar1 + 0xc;
      if (this->RnW == false) {
        SWDBit::MakeFrame(&local_78);
        local_88 = (undefined2)local_78.low_end;
        local_98 = local_78.rising;
        uStack_90 = local_78.falling;
        local_a8._0_4_ = local_78.state_rising;
        local_a8._4_4_ = local_78.state_falling;
        lStack_a0 = local_78.low_start;
        Frame::~Frame((Frame *)&local_78);
        local_88 = CONCAT11(local_88._1_1_,4);
        AnalyzerResults::AddFrame((Frame *)pResults);
        pSVar4 = pSVar1 + 0xd;
      }
      SWDBit::MakeFrame(&local_78);
      local_88 = (undefined2)local_78.low_end;
      local_98 = local_78.rising;
      uStack_90 = local_78.falling;
      local_a8._0_4_ = local_78.state_rising;
      local_a8._4_4_ = local_78.state_falling;
      lStack_a0 = local_78.low_start;
      Frame::~Frame((Frame *)&local_78);
      lVar3 = (pSVar4[0x1f].rising - pSVar4[0x1f].low_start) / 2;
      lVar2 = (pSVar4[0x1f].low_end - pSVar4[0x1f].falling) / 2;
      if (lVar3 < lVar2) {
        lVar2 = lVar3;
      }
      lStack_a0 = pSVar4[0x1f].falling + lVar2 + -1;
      local_88 = CONCAT11(local_88._1_1_,6);
      local_98 = (ulong)this->data;
      uStack_90 = (ulong)this->reg;
      AnalyzerResults::AddFrame((Frame *)pResults);
      SWDBit::MakeFrame(&local_78);
      local_88 = (undefined2)local_78.low_end;
      local_98 = local_78.rising;
      uStack_90 = local_78.falling;
      local_a8._0_4_ = local_78.state_rising;
      local_a8._4_4_ = local_78.state_falling;
      lStack_a0 = local_78.low_start;
      Frame::~Frame((Frame *)&local_78);
      local_88 = CONCAT11(local_88._1_1_,7);
      local_98 = (ulong)this->data_parity;
      uStack_90 = (ulong)this->data_parity_ok;
      AnalyzerResults::AddFrame((Frame *)pResults);
      pSVar1 = (this->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar4 + 0x21 < pSVar1) {
        lVar3 = (pSVar4[0x21].rising - pSVar4[0x21].low_start) / 2;
        lVar2 = (pSVar4[0x21].low_end - pSVar4[0x21].falling) / 2;
        if (lVar3 < lVar2) {
          lVar2 = lVar3;
        }
        local_a8 = (pSVar4[0x21].rising - lVar2) + 1;
        lVar3 = (pSVar1[-1].rising - pSVar1[-1].low_start) / 2;
        lVar2 = (pSVar1[-1].low_end - pSVar1[-1].falling) / 2;
        if (lVar3 < lVar2) {
          lVar2 = lVar3;
        }
        lStack_a0 = pSVar1[-1].falling + lVar2 + -1;
        local_88 = 8;
        local_98 = 0;
        uStack_90 = 0;
        AnalyzerResults::AddFrame((Frame *)pResults);
      }
    }
    Frame::~Frame((Frame *)&local_50);
    Frame::~Frame((Frame *)&local_a8);
    return;
  }
  __assert_fail("bits.size() >= TRAN_REQ_AND_ACK",
                "/workspace/llm4binary/github/license_c_cmakelists/saleae[P]swd-analyzer/src/SWDTypes.cpp"
                ,0x47,"void SWDOperation::AddFrames(SWDAnalyzerResults *)");
}

Assistant:

void SWDOperation::AddFrames( SWDAnalyzerResults* pResults )
{
    Frame f;

    assert( bits.size() >= TRAN_REQ_AND_ACK );

    // request
    SWDRequestFrame req;
    req.mStartingSampleInclusive = bits[ 0 ].GetStartSample();
    req.mEndingSampleInclusive = bits[ 7 ].GetEndSample();
    req.mFlags = ( IsRead() ? SWDRequestFrame::IS_READ : 0 ) | ( APnDP ? SWDRequestFrame::IS_ACCESS_PORT : 0 );
    req.SetRequestByte( request_byte );
    req.SetRegister( reg );
    req.mType = SWDFT_Request;
    pResults->AddFrame( req );

    // turnaround
    f = bits[ 8 ].MakeFrame();
    f.mType = SWDFT_Turnaround;
    pResults->AddFrame( f );

    // ack
    f.mStartingSampleInclusive = bits[ 9 ].GetStartSample();
    f.mEndingSampleInclusive = bits[ 11 ].GetEndSample();
    f.mType = SWDFT_ACK;
    f.mData1 = ACK;
    pResults->AddFrame( f );

    if( bits.size() < TRAN_READ_LENGTH )
        return;

    // turnaround
    std::vector<SWDBit>::iterator bi( bits.begin() + 12 );
    if( !IsRead() )
    {
        f = bits[ 12 ].MakeFrame();
        f.mType = SWDFT_Turnaround;
        pResults->AddFrame( f );
        bi++;
    }

    // data
    f = bi->MakeFrame();
    f.mEndingSampleInclusive = bi[ 31 ].GetEndSample();
    f.mType = SWDFT_WData;
    f.mData1 = data;
    f.mData2 = reg;
    pResults->AddFrame( f );

    // data parity
    f = bi[ 32 ].MakeFrame();
    f.mType = SWDFT_DataParity;
    f.mData1 = data_parity;
    f.mData2 = data_parity_ok ? 1 : 0;
    pResults->AddFrame( f );

    bi += 33;

    // do we have trailing bits?
    if( bi < bits.end() )
    {
        f.mStartingSampleInclusive = bi->GetStartSample();
        f.mEndingSampleInclusive = bits.back().GetEndSample();
        f.mType = SWDFT_TrailingBits;

        f.mFlags = 0;
        f.mData1 = 0;
        f.mData2 = 0;

        pResults->AddFrame( f );
    }
}